

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogDerivativesPartials
          (BeagleCPUImpl<double,_1,_0> *this,double *postOrderPartial,double *preOrderPartial,
          int firstDerivativeIndex,int secondDerivativeIndex,double *categoryRates,
          double *categoryWeights,int scalingFactorsIndex,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  int k;
  ulong uVar17;
  int j;
  ulong uVar18;
  undefined1 auVar19 [16];
  double sumOverEndState;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  uVar4 = this->kPatternCount;
  uVar5 = this->kCategoryCount;
  lVar12 = 0;
  pdVar8 = this->gTransitionMatrices[firstDerivativeIndex];
  for (uVar14 = 0; uVar14 != (~((int)uVar5 >> 0x1f) & uVar5); uVar14 = uVar14 + 1) {
    uVar6 = this->kStateCount;
    lVar16 = (long)this->kPartialsPaddedStateCount;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = categoryWeights[uVar14];
    pdVar9 = this->grandNumeratorDerivTmp;
    pdVar10 = this->grandDenominatorDerivTmp;
    iVar7 = this->kMatrixSize;
    pdVar11 = (double *)(lVar12 * lVar16 + (long)postOrderPartial);
    for (uVar13 = 0; uVar13 != (~((int)uVar4 >> 0x1f) & uVar4); uVar13 = uVar13 + 1) {
      auVar20 = ZEXT816(0) << 0x40;
      auVar21 = ZEXT816(0) << 0x40;
      uVar17 = 0;
      iVar15 = iVar7 * (int)uVar14;
      while (uVar17 != (~((int)uVar6 >> 0x1f) & uVar6)) {
        auVar22 = ZEXT816(0) << 0x40;
        for (uVar18 = 0; uVar6 != uVar18; uVar18 = uVar18 + 1) {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = pdVar8[(long)iVar15 + uVar18];
          auVar2._8_8_ = 0;
          auVar2._0_8_ = pdVar11[uVar18];
          auVar22 = vfmadd231sd_fma(auVar22,auVar23,auVar2);
        }
        lVar1 = uVar17 + (uVar14 * (long)(int)uVar4 + uVar13) * lVar16;
        uVar17 = uVar17 + 1;
        iVar15 = iVar15 + uVar6 + 1;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = preOrderPartial[lVar1];
        auVar3._8_8_ = 0;
        auVar3._0_8_ = postOrderPartial[lVar1];
        auVar21 = vfmadd231sd_fma(auVar21,auVar24,auVar3);
        auVar20 = vfmadd231sd_fma(auVar20,auVar24,auVar22);
      }
      auVar22._8_8_ = 0;
      auVar22._0_8_ = pdVar9[uVar13];
      auVar20 = vfmadd213sd_fma(auVar20,auVar19,auVar22);
      pdVar11 = pdVar11 + lVar16;
      pdVar9[uVar13] = auVar20._0_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = pdVar10[uVar13];
      auVar21 = vfmadd213sd_fma(auVar21,auVar19,auVar20);
      pdVar10[uVar13] = auVar21._0_8_;
    }
    lVar12 = lVar12 + (long)(int)uVar4 * 8;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivativesPartials(const REALTYPE *postOrderPartial,
                                                                       const REALTYPE *preOrderPartial,
                                                                       const int firstDerivativeIndex,
                                                                       const int secondDerivativeIndex,
                                                                       const double *categoryRates,
                                                                       const REALTYPE *categoryWeights,
                                                                       const int scalingFactorsIndex,
//                                                                       const REALTYPE *cumulativeScaleBuffer,
                                                                       double *outDerivatives,
                                                                       double *outSumDerivatives,
                                                                       double *outSumSquaredDerivatives) {

    const REALTYPE *firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];

    for (int category = 0; category < kCategoryCount; category++) {
        const REALTYPE weight = categoryWeights[category];

        for (int pattern = 0; pattern < kPatternCount; pattern++) {

            int w = category * kMatrixSize;

            const int patternIndex = category * kPatternCount + pattern;
            const int v = patternIndex * kPartialsPaddedStateCount;

            REALTYPE numerator = 0.0;
            REALTYPE denominator = 0.0;

            for (int k = 0; k < kStateCount; k++) {

                REALTYPE sumOverEndState = 0.0;
                for (int j = 0; j < kStateCount; j++) {
                    sumOverEndState += firstDerivMatrix[w]
                                       * postOrderPartial[v + j]; // fix padded index
                    w++;
                }
                w += T_PAD;

                numerator += sumOverEndState * preOrderPartial[v + k];
                denominator += postOrderPartial[v + k] * preOrderPartial[v + k];
            }

            grandNumeratorDerivTmp[pattern] += weight * numerator;
            grandDenominatorDerivTmp[pattern] += weight * denominator;
        }
    }
}